

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O2

void __thiscall tcu::TestHierarchyIterator::~TestHierarchyIterator(TestHierarchyIterator *this)

{
  pointer pNVar1;
  TestNodeType TVar2;
  long lVar3;
  __normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>
  __tmp;
  pointer pNVar4;
  
  pNVar4 = (this->m_sessionStack).
           super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while (pNVar4 != (this->m_sessionStack).
                   super__Vector_base<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
    pNVar1 = pNVar4 + -1;
    pNVar4 = pNVar4 + -1;
    TVar2 = pNVar1->node->m_nodeType;
    lVar3 = 8;
    if ((TVar2 == NODETYPE_PACKAGE) || (lVar3 = 0x18, TVar2 == NODETYPE_GROUP)) {
      (**(code **)((long)this->m_inflater->_vptr_TestHierarchyInflater + lVar3))();
    }
  }
  std::__cxx11::string::~string((string *)&this->m_nodePath);
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::~vector(&this->m_sessionStack);
  return;
}

Assistant:

TestHierarchyIterator::~TestHierarchyIterator (void)
{
	// Tear down inflated nodes in m_sessionStack
	for (vector<NodeIter>::reverse_iterator iter = m_sessionStack.rbegin(); iter != m_sessionStack.rend(); ++iter)
	{
		TestNode* const		node		= iter->node;
		const TestNodeType	nodeType	= node->getNodeType();

		switch (nodeType)
		{
			case NODETYPE_ROOT:		/* root is not de-initialized */								break;
			case NODETYPE_PACKAGE:	m_inflater.leaveTestPackage(static_cast<TestPackage*>(node));	break;
			case NODETYPE_GROUP:	m_inflater.leaveGroupNode(static_cast<TestCaseGroup*>(node));	break;
			default:
				break;
		}
	}
}